

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-lexer.cpp
# Opt level: O0

void __thiscall LexerTest_LexNan_Test::LexerTest_LexNan_Test(LexerTest_LexNan_Test *this)

{
  LexerTest_LexNan_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__LexerTest_LexNan_Test_00351b18;
  return;
}

Assistant:

TEST(LexerTest, LexNan) {
  const double posNan = std::copysign(NAN, 1.0);
  const double negNan = std::copysign(NAN, -1.0);
  {
    Lexer lexer("nan"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"nan"sv, FloatTok{{}, posNan}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("+nan"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"+nan"sv, FloatTok{{}, posNan}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("-nan"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"-nan"sv, FloatTok{{}, negNan}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("nan:0x01"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"nan:0x01"sv, FloatTok{{1}, posNan}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("+nan:0x01"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"+nan:0x01"sv, FloatTok{{1}, posNan}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("-nan:0x01"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"-nan:0x01"sv, FloatTok{{1}, negNan}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("nan:0x1234"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"nan:0x1234"sv, FloatTok{{0x1234}, posNan}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("nan:0xf_ffff_ffff_ffff"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"nan:0xf_ffff_ffff_ffff"sv,
                   FloatTok{{0xfffffffffffff}, posNan}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("nanjunk"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"nanjunk", KeywordTok{}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("nan:"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"nan:"sv, KeywordTok{}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("nan:0x"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"nan:0x"sv, KeywordTok{}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("nan:0xjunk"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"nan:0xjunk"sv, KeywordTok{}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("nan:-0x1"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"nan:-0x1"sv, KeywordTok{}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("nan:+0x1"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"nan:+0x1"sv, KeywordTok{}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("nan:0x0"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"nan:0x0"sv, FloatTok{{0}, posNan}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("nan:0x10_0000_0000_0000"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"nan:0x10_0000_0000_0000"sv,
                   FloatTok{{0x10000000000000}, posNan}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("nan:0x1_0000_0000_0000_0000"sv);
    ASSERT_FALSE(lexer.empty());
    Token expected{"nan:0x1_0000_0000_0000_0000"sv, KeywordTok{}};
    EXPECT_EQ(*lexer, expected);
  }
  {
    Lexer lexer("NAN"sv);
    EXPECT_TRUE(lexer.empty());
  }
  {
    Lexer lexer("NaN"sv);
    EXPECT_TRUE(lexer.empty());
  }
}